

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O3

int __thiscall
Arcflow::min_slack(Arcflow *this,vector<int,_std::allocator<int>_> *b,int i0,int d,
                  vector<int,_std::allocator<int>_> *caps)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  const_iterator __begin2;
  ulong uVar4;
  pointer piVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  vector<int,_std::allocator<int>_> *__range2;
  ulong uVar14;
  vector<int,_std::allocator<int>_> Q;
  uint local_b0;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> local_a8;
  Arcflow *local_88;
  long local_80;
  vector<int,_std::allocator<int>_> *local_78;
  vector<int,_std::allocator<int>_> *local_70;
  ulong local_68;
  ulong local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  uVar1 = (caps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish[-1];
  if ((long)(int)uVar1 == 0) {
    iVar8 = 0;
  }
  else {
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_b0 = local_b0 & 0xffffff00;
    local_78 = b;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_58,(long)(int)uVar1 + 1,(bool *)&local_b0,&local_a9);
    *local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
     super__Bit_iterator_base._M_p =
         *local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p | 1;
    local_b0 = 0;
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_b0);
    }
    else {
      *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = 0;
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    uVar7 = 0;
    if (i0 < (this->inst).nsizes) {
      local_80 = (long)d;
      lVar9 = (long)i0;
      uVar7 = 0;
      local_88 = this;
      local_70 = caps;
      do {
        lVar10 = *(long *)&(local_88->weights).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar9].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data;
        if (*(int *)(lVar10 + local_80 * 4) != 0) {
          uVar4 = (ulong)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2;
          uVar3 = (uint)uVar4;
          if (0 < (int)uVar3) {
            local_60 = (ulong)(uVar3 & 0x7fffffff);
            piVar5 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar14 = 0;
            local_68 = uVar4;
            do {
              local_b0 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14];
              if ((0 < piVar5[lVar9]) &&
                 (local_b0 = local_b0 + *(int *)(lVar10 + local_80 * 4), (int)local_b0 <= (int)uVar1
                 )) {
                iVar8 = 0;
                while( true ) {
                  if (local_b0 == uVar1) {
                    iVar8 = 0;
                    goto LAB_0010b7fe;
                  }
                  uVar3 = local_b0 + 0x3f;
                  if (-1 < (int)local_b0) {
                    uVar3 = local_b0;
                  }
                  if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [(long)((int)uVar3 >> 6) +
                        ((ulong)(((long)(int)local_b0 & 0x800000000000003fU) < 0x8000000000000001) -
                        1)] >> ((ulong)local_b0 & 0x3f) & 1) != 0) break;
                  if ((int)uVar7 <= (int)local_b0) {
                    uVar7 = local_b0;
                  }
                  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_a8,
                               (iterator)
                               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,(int *)&local_b0);
                    piVar5 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start;
                  }
                  else {
                    *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_b0;
                    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  iVar8 = iVar8 + 1;
                  if ((piVar5[lVar9] <= iVar8) ||
                     (local_b0 = local_b0 + *(int *)(lVar10 + local_80 * 4),
                     (int)uVar1 < (int)local_b0)) break;
                }
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != local_60);
            iVar8 = (int)((ulong)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2);
            caps = local_70;
            if ((int)local_68 < iVar8) {
              lVar10 = (long)(int)local_68;
              do {
                iVar12 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10];
                iVar11 = iVar12 + 0x3f;
                if (-1 < (long)iVar12) {
                  iVar11 = iVar12;
                }
                local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p
                [(long)(iVar11 >> 6) +
                 ((ulong)(((long)iVar12 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
                     local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(long)(iVar11 >> 6) +
                      ((ulong)(((long)iVar12 & 0x800000000000003fU) < 0x8000000000000001) - 1)] |
                     1L << ((byte)iVar12 & 0x3f);
                lVar10 = lVar10 + 1;
              } while (iVar8 != lVar10);
            }
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (local_88->inst).nsizes);
    }
    piVar6 = (caps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    iVar8 = *piVar6 - uVar7;
    if (*piVar6 < (int)uVar7) {
      iVar8 = uVar1 - uVar7;
      for (; piVar6 != (caps->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
        iVar12 = -1;
        uVar4 = (long)*piVar6;
        do {
          iVar11 = (int)uVar4;
          iVar13 = iVar11 + 0x3f;
          if (-1 < iVar11) {
            iVar13 = iVar11;
          }
          iVar12 = iVar12 + 1;
        } while (((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [(long)(iVar13 >> 6) +
                    ((ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                   (uVar4 & 0x3f) & 1) == 0) &&
                (bVar2 = (long)*piVar6 - (long)iVar8 <= (long)uVar4, uVar4 = uVar4 - 1, bVar2));
        if (iVar12 < iVar8) {
          iVar8 = iVar12;
        }
      }
    }
LAB_0010b7fe:
    if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
      operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (ulong *)0x0;
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
    }
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return iVar8;
}

Assistant:

int Arcflow::min_slack(const std::vector<int> &b, int i0, int d,
					   const std::vector<int> &caps) const {
	int C = caps.back();
	if (C == 0) {
		return 0;
	}
	std::vector<int> Q;
	std::vector<bool> vis(C + 1);
	vis[0] = true;
	Q.push_back(0);
	int res = 0;
	for (int i = i0; i < inst.nsizes; i++) {
		const int &w = weights[i][d];
		if (!w) {
			continue;
		}
		int qs = Q.size();
		for (int j = 0; j < qs; j++) {
			int u = Q[j];
			int v = u;
			for (int k = 1; k <= b[i]; k++) {
				v += w;
				if (v > C) {
					break;
				} else if (v == C) {
					return 0;
				} else if (vis[v]) {
					break;
				}
				res = std::max(res, v);
				Q.push_back(v);
			}
		}
		for (int j = qs; j < static_cast<int>(Q.size()); j++) {
			vis[Q[j]] = true;
		}
	}
	if (res <= caps[0]) {
		return caps[0] - res;
	} else {
		int mslack = C - res;
		for (int cap : caps) {
			int p = cap;
			while (!vis[p] && cap - p <= mslack) {
				p--;
			}
			mslack = std::min(mslack, cap - p);
		}
		return mslack;
	}
}